

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O3

void ref_swap_tattle_nodes(REF_CELL ref_cell,REF_INT node0,REF_INT node1)

{
  uint uVar1;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  int local_38;
  
  if (((-1 < node0) && (pRVar2 = ref_cell->ref_adj, node0 < pRVar2->nnode)) &&
     (lVar6 = (long)pRVar2->first[(uint)node0], lVar6 != -1)) {
    pRVar3 = pRVar2->item + lVar6;
    iVar4 = ref_cell->node_per;
    while( true ) {
      if (0 < iVar4) {
        uVar1 = pRVar3->ref;
        iVar7 = 0;
        do {
          iVar5 = ref_cell->size_per * uVar1;
          if (ref_cell->c2n[iVar5 + iVar7] == node1) {
            printf("cell %d cell id %d\n",(ulong)uVar1,(ulong)(uint)ref_cell->c2n[iVar5 + iVar4]);
            iVar4 = ref_cell->node_per;
            if (0 < iVar4) {
              lVar8 = 0;
              do {
                printf(" %d",(ulong)(uint)ref_cell->c2n
                                          [(long)ref_cell->size_per * (long)(int)uVar1 + lVar8]);
                iVar4 = ref_cell->node_per;
                lVar8 = lVar8 + 1;
              } while ((int)lVar8 < iVar4);
            }
            printf(" %d\n",(ulong)(uint)ref_cell->c2n[(int)(ref_cell->size_per * uVar1 + iVar4)]);
            iVar4 = ref_cell->node_per;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar4);
      }
      pRVar3 = ref_cell->ref_adj->item;
      local_38 = (int)lVar6;
      lVar6 = (long)pRVar3[local_38].next;
      if (lVar6 == -1) break;
      pRVar3 = pRVar3 + lVar6;
    }
  }
  return;
}

Assistant:

static void ref_swap_tattle_nodes(REF_CELL ref_cell, REF_INT node0,
                                  REF_INT node1) {
  REF_INT item, cell_node, cell, cell_node2;
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    printf("cell %d cell id %d\n", cell,
           ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
    each_ref_cell_cell_node(ref_cell, cell_node2) {
      printf(" %d", ref_cell_c2n(ref_cell, cell_node2, cell));
    }
    printf(" %d\n", ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell));
  }
}